

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O2

void InfoCallback(SSL *ssl,int type,int value)

{
  FILE *__stream;
  char *pcVar1;
  size_t __size;
  
  __stream = _stderr;
  if (type == 0x1001) {
    pcVar1 = SSL_state_string_long((SSL *)ssl);
    fprintf(__stream,"Handshake progress: %s\n",pcVar1);
    return;
  }
  if (type == 0x20) {
    pcVar1 = "Handshake done.\n";
    __size = 0x10;
  }
  else {
    if (type != 0x10) {
      return;
    }
    pcVar1 = "Handshake started.\n";
    __size = 0x13;
  }
  fwrite(pcVar1,__size,1,_stderr);
  return;
}

Assistant:

static void InfoCallback(const SSL *ssl, int type, int value) {
  switch (type) {
    case SSL_CB_HANDSHAKE_START:
      fprintf(stderr, "Handshake started.\n");
      break;
    case SSL_CB_HANDSHAKE_DONE:
      fprintf(stderr, "Handshake done.\n");
      break;
    case SSL_CB_CONNECT_LOOP:
      fprintf(stderr, "Handshake progress: %s\n", SSL_state_string_long(ssl));
      break;
  }
}